

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O1

error_code __thiscall
asio::detail::reactive_socket_service<asio::ip::udp>::
set_option<asio::detail::socket_option::integer<1,8>>
          (reactive_socket_service<asio::ip::udp> *this,implementation_type *impl,
          integer<1,_8> *option,error_code *ec)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  error_category *peVar4;
  error_code eVar5;
  
  iVar1 = (impl->super_base_implementation_type).socket_;
  if (iVar1 == -1) {
    std::error_code::operator=(ec,bad_descriptor);
  }
  else {
    piVar3 = __errno_location();
    *piVar3 = 0;
    iVar2 = setsockopt(iVar1,1,8,option,4);
    iVar1 = *piVar3;
    if (system_category()::instance == '\0') {
      set_option<asio::detail::socket_option::integer<1,8>>();
    }
    ec->_M_value = iVar1;
    ec->_M_cat = (error_category *)&system_category()::instance;
    if (iVar2 == 0) {
      peVar4 = (error_category *)std::_V2::system_category();
      ec->_M_value = 0;
      ec->_M_cat = peVar4;
    }
  }
  eVar5._4_4_ = 0;
  eVar5._M_value = ec->_M_value;
  eVar5._M_cat = ec->_M_cat;
  return eVar5;
}

Assistant:

asio::error_code set_option(implementation_type& impl,
      const Option& option, asio::error_code& ec)
  {
    socket_ops::setsockopt(impl.socket_, impl.state_,
        option.level(impl.protocol_), option.name(impl.protocol_),
        option.data(impl.protocol_), option.size(impl.protocol_), ec);
    return ec;
  }